

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O2

void __thiscall tst_qpromise_operators::equalTo(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  bool bVar2;
  bool local_4a;
  bool local_49;
  QPromise<int> p2;
  QPromise<int> p3;
  QPromise<int> p1;
  QPromise<int> p0;
  
  p1.super_QPromiseBase<int>._vptr_QPromiseBase._0_4_ = 0x2a;
  QtPromise::QPromise<int>::resolve(&p0,(int *)&p1);
  p2.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(p2.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0x2a);
  QtPromise::QPromise<int>::resolve(&p1,(int *)&p2);
  p2.super_QPromiseBase<int>.m_d = p1.super_QPromiseBase<int>.m_d;
  if (p1.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
    p3.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  }
  else {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    p3.super_QPromiseBase<int>.m_d = p1.super_QPromiseBase<int>.m_d;
  }
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119ba0;
  if (p3.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p3.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_49 = p0.super_QPromiseBase<int>.m_d.d == p1.super_QPromiseBase<int>.m_d.d;
  p3.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119ba0;
  local_4a = false;
  bVar2 = QTest::qCompare<bool,bool>
                    (&local_49,&local_4a,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x99);
  if (bVar2) {
    local_49 = p0.super_QPromiseBase<int>.m_d.d == p2.super_QPromiseBase<int>.m_d.d;
    local_4a = false;
    bVar2 = QTest::qCompare<bool,bool>
                      (&local_49,&local_4a,"p0 == p2","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x9a);
    if (bVar2) {
      local_49 = p0.super_QPromiseBase<int>.m_d.d == p3.super_QPromiseBase<int>.m_d.d;
      local_4a = false;
      bVar2 = QTest::qCompare<bool,bool>
                        (&local_49,&local_4a,"p0 == p3","false",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x9b);
      if (bVar2) {
        local_49 = p1.super_QPromiseBase<int>.m_d.d == p2.super_QPromiseBase<int>.m_d.d;
        local_4a = true;
        bVar2 = QTest::qCompare<bool,bool>
                          (&local_49,&local_4a,"p1 == p2","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x9c);
        if (bVar2) {
          local_49 = p1.super_QPromiseBase<int>.m_d.d == p3.super_QPromiseBase<int>.m_d.d;
          local_4a = true;
          bVar2 = QTest::qCompare<bool,bool>
                            (&local_49,&local_4a,"p1 == p3","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x9d);
          if (bVar2) {
            local_49 = p2.super_QPromiseBase<int>.m_d.d == p3.super_QPromiseBase<int>.m_d.d;
            local_4a = true;
            QTest::qCompare<bool,bool>
                      (&local_49,&local_4a,"p2 == p3","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x9e);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p3.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p2.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_operators::equalTo()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);
    auto p1 = QtPromise::QPromise<int>::resolve(42);
    auto p2 = p1;
    auto p3(p2);

    QCOMPARE(p0 == p1, false);
    QCOMPARE(p0 == p2, false);
    QCOMPARE(p0 == p3, false);
    QCOMPARE(p1 == p2, true);
    QCOMPARE(p1 == p3, true);
    QCOMPARE(p2 == p3, true);
}